

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionEvaluation.hpp
# Opt level: O0

Option<Kernel::PolyNf> *
Inferences::simplFloor<Kernel::NumTraits<Kernel::RealConstantType>>(PolyNf *evalArgs)

{
  FuncId f;
  bool bVar1;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *pSVar2;
  size_t sVar3;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *summands;
  remove_reference_t<Kernel::RealConstantType> *numeral;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *pSVar4;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar5;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *__first;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *__last;
  Option<Kernel::PolyNf> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  FuncId FVar6;
  PolyNf out;
  PolyNf floorTerm;
  PolyNf innerSum;
  Numeral numFloor;
  Numeral i;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  t;
  Numeral k;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  StlIter __end0;
  StlIter __begin0;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range3;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  keptIn;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  pulledOut;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  poly;
  Option<Kernel::RealConstantType> inner;
  StlIter *in_stack_fffffffffffff968;
  StlIter *in_stack_fffffffffffff970;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffff978;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffff980;
  Numeral *in_stack_fffffffffffff988;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffff990;
  PolyNf *in_stack_fffffffffffff998;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  uint in_stack_fffffffffffff9ac;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_fffffffffffff9b0;
  FuncTerm *in_stack_fffffffffffff9b8;
  RealConstantType *in_stack_fffffffffffff9c8;
  PolyNf *in_stack_fffffffffffff9d8;
  undefined7 in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9e7;
  RealConstantType local_310 [3];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_2b0 [6];
  undefined4 local_24c;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_228 [6];
  undefined4 local_1c4;
  RealConstantType local_1a0;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_170 [5];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_120 [3];
  undefined1 local_f0 [32];
  undefined1 *local_d0;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_a8;
  undefined4 local_94;
  RealConstantType local_90 [4];
  
  Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>
            ((PolyNf *)in_stack_fffffffffffff978);
  bVar1 = Lib::Option::operator_cast_to_bool((Option<Kernel::RealConstantType> *)0x81a504);
  if (bVar1) {
    Lib::Option<Kernel::RealConstantType>::operator->((Option<Kernel::RealConstantType> *)0x81a52a);
    Kernel::RealConstantType::floor(local_90,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Kernel::RealConstantType::RealConstantType
              (&in_stack_fffffffffffff9a0->numeral,(IntegerConstantType *)in_stack_fffffffffffff998)
    ;
    Kernel::PolyNf::fromNumeral<Kernel::RealConstantType>(in_stack_fffffffffffff9c8);
    Lib::some<Kernel::PolyNf>((PolyNf *)in_stack_fffffffffffff968);
    Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81a59d);
    Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x81a5aa);
    local_94 = 1;
    goto LAB_0081b378;
  }
  Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RealConstantType>>(in_stack_fffffffffffff9d8);
  Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffff970);
  Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffff970);
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>::
  operator->(&local_a8);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::iterSummands
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_stack_fffffffffffff970);
  local_d0 = local_f0;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           *)in_stack_fffffffffffff968);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
         *)in_stack_fffffffffffff968);
  while (bVar1 = Lib::operator!=(in_stack_fffffffffffff970,in_stack_fffffffffffff968), bVar1) {
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::operator*((StlIter *)0x81a6eb);
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
              (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    Kernel::RealConstantType::RealConstantType
              ((RealConstantType *)in_stack_fffffffffffff970,
               (RealConstantType *)in_stack_fffffffffffff968);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
    ::Perfect(local_170,local_120);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
    ::operator*(local_170);
    bVar1 = isInteger<Kernel::NumTraits<Kernel::RealConstantType>>
                      ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                       in_stack_fffffffffffff990);
    if (bVar1) {
      Kernel::RealConstantType::floor
                (&local_1a0,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      Kernel::RealConstantType::RealConstantType
                (&in_stack_fffffffffffff9a0->numeral,
                 (IntegerConstantType *)in_stack_fffffffffffff998);
      Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x81a7b2);
      Kernel::RealConstantType::RealConstantType
                ((RealConstantType *)in_stack_fffffffffffff970,
                 (RealConstantType *)in_stack_fffffffffffff968);
      local_1c4 = 0;
      bVar1 = Kernel::operator!=((RealConstantType *)in_stack_fffffffffffff9b0,
                                 (int *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8
                                                ));
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81a7ff);
      if (bVar1) {
        Lib::
        Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)0x81a81c);
        Kernel::RealConstantType::RealConstantType
                  ((RealConstantType *)in_stack_fffffffffffff970,
                   (RealConstantType *)in_stack_fffffffffffff968);
        Lib::
        Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
        ::Perfect(local_228,local_170);
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                  (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                   (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                    *)in_stack_fffffffffffff980);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                  ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                   in_stack_fffffffffffff980,in_stack_fffffffffffff978);
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                  ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81a897);
        Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81a8a4);
      }
      Kernel::RealConstantType::operator-
                ((RealConstantType *)in_stack_fffffffffffff9b8,
                 (RealConstantType *)in_stack_fffffffffffff9b0);
      local_24c = 0;
      bVar1 = Kernel::operator!=((RealConstantType *)in_stack_fffffffffffff9b0,
                                 (int *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8
                                                ));
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81aa10);
      if (bVar1) {
        Lib::
        Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)0x81aa2d);
        Kernel::RealConstantType::operator-
                  ((RealConstantType *)in_stack_fffffffffffff9b8,
                   (RealConstantType *)in_stack_fffffffffffff9b0);
        Lib::
        Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
        ::Perfect(local_2b0,local_170);
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                  (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                   (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                    *)in_stack_fffffffffffff980);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                  ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                   in_stack_fffffffffffff980,in_stack_fffffffffffff978);
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                  ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81aab0);
        Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81aabd);
      }
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81ab35);
    }
    else {
      Lib::
      Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x81ab59);
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                 in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81ab9e);
    }
    Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81abd0);
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81abdd);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::operator++(in_stack_fffffffffffff970);
  }
  pSVar2 = Lib::
           Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x81ac1d);
  sVar3 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size(pSVar2);
  if (sVar3 == 0) {
    *(undefined8 *)((long)&(in_RDI->super_OptionBase<Kernel::PolyNf>)._elem._elem + 8) = 0;
    *(undefined8 *)((long)&(in_RDI->super_OptionBase<Kernel::PolyNf>)._elem._elem + 0x10) = 0;
    *(undefined8 *)&in_RDI->super_OptionBase<Kernel::PolyNf> = 0;
    *(undefined8 *)((long)&(in_RDI->super_OptionBase<Kernel::PolyNf>)._elem._elem + 4) = 0;
    Lib::Option<Kernel::PolyNf>::Option((Option<Kernel::PolyNf> *)0x81ac63);
  }
  else {
    pSVar2 = Lib::
             Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x81ac82);
    summands = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
               Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size
                         (pSVar2);
    if (summands != (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)0x0) {
      pSVar4 = Lib::
               Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x81acc3);
      sVar3 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size(pSVar4)
      ;
      if (sVar3 == 1) {
        pSVar4 = Lib::
                 Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 ::operator*((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                              *)0x81ad03);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
                  (pSVar4,0);
        in_stack_fffffffffffff9e7 =
             Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::isNumeral
                       (in_stack_fffffffffffff9a0);
        if ((bool)in_stack_fffffffffffff9e7) {
          pSVar4 = Lib::
                   Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   ::operator*((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                *)0x81ad55);
          pMVar5 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
                   operator[](pSVar4,0);
          Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::tryNumeral
                    (in_stack_fffffffffffff978);
          numeral = Lib::Option<Kernel::RealConstantType>::operator->
                              ((Option<Kernel::RealConstantType> *)0x81ad92);
          Kernel::RealConstantType::floor
                    (local_310,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
          Kernel::RealConstantType::RealConstantType
                    (&in_stack_fffffffffffff9a0->numeral,
                     (IntegerConstantType *)in_stack_fffffffffffff998);
          Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x81add1);
          Lib::Option<Kernel::RealConstantType>::~Option
                    ((Option<Kernel::RealConstantType> *)0x81adde);
          Kernel::RealConstantType::RealConstantType
                    ((RealConstantType *)in_stack_fffffffffffff970,
                     (RealConstantType *)in_stack_fffffffffffff968);
          bVar1 = Kernel::operator!=((RealConstantType *)in_stack_fffffffffffff9b0,
                                     (int *)CONCAT44(in_stack_fffffffffffff9ac,
                                                     in_stack_fffffffffffff9a8));
          Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81ae28);
          if (bVar1) {
            Lib::
            Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x81ae42);
            Kernel::RealConstantType::RealConstantType
                      ((RealConstantType *)in_stack_fffffffffffff970,
                       (RealConstantType *)in_stack_fffffffffffff968);
            Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom(pMVar5,numeral);
            Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                      ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                       in_stack_fffffffffffff980,in_stack_fffffffffffff978);
            Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                      ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81ae98);
            Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81aea5);
          }
          Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81af7f);
          goto LAB_0081b224;
        }
      }
      in_stack_fffffffffffff9b0 =
           Lib::
           Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           ::operator*((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x81afa3);
      Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
                ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)pSVar2,summands);
      Lib::
      perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      Kernel::AnyPoly::AnyPoly<Kernel::NumTraits<Kernel::RealConstantType>>
                ((AnyPoly *)in_stack_fffffffffffff980,
                 (Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                  *)in_stack_fffffffffffff978);
      Kernel::PolyNf::PolyNf
                ((PolyNf *)in_stack_fffffffffffff990,(AnyPoly *)in_stack_fffffffffffff988);
      Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
                ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81b010);
      FVar6 = Kernel::FuncId::fromInterpretation(EQUAL);
      in_stack_fffffffffffff9ac = FVar6._num;
      f._4_4_ = in_stack_fffffffffffff9ac;
      f._num = in_stack_fffffffffffff9a8;
      f._typeArgs = (TermList *)in_stack_fffffffffffff9b0;
      Kernel::FuncTerm::FuncTerm((FuncTerm *)FVar6._typeArgs,f,in_stack_fffffffffffff998);
      Lib::perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>(in_stack_fffffffffffff9b8);
      Kernel::PolyNf::PolyNf
                ((PolyNf *)in_stack_fffffffffffff980,
                 (Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *)in_stack_fffffffffffff978);
      Kernel::FuncTerm::~FuncTerm((FuncTerm *)0x81b09e);
      Lib::
      Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x81b0ab);
      Kernel::RealConstantType::RealConstantType
                ((RealConstantType *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
      Kernel::PolyNf::PolyNf
                ((PolyNf *)in_stack_fffffffffffff970,(PolyNf *)in_stack_fffffffffffff968);
      Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 in_stack_fffffffffffff9d8);
      Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                 (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                  *)in_stack_fffffffffffff980);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                 in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81b14b);
      Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::~MonomFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81b158);
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x81b165);
    }
LAB_0081b224:
    pSVar4 = Lib::
             Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x81b231);
    pMVar5 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::begin(pSVar4)
    ;
    __first = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
              Lib::
              Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::operator->((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                            *)0x81b256);
    __last = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::end
                       ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                        __first);
    std::sort<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*>(__first,__last);
    Lib::
    Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator*((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0x81b28c);
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)pSVar2,summands);
    Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    Kernel::AnyPoly::AnyPoly<Kernel::NumTraits<Kernel::RealConstantType>>
              ((AnyPoly *)__first,
               (Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                *)__last);
    Kernel::PolyNf::PolyNf((PolyNf *)pSVar4,(AnyPoly *)pMVar5);
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81b2f9);
    Lib::some<Kernel::PolyNf>((PolyNf *)in_stack_fffffffffffff968);
  }
  local_94 = 1;
  Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_stack_fffffffffffff9b0);
  Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_stack_fffffffffffff9b0);
LAB_0081b378:
  Lib::Option<Kernel::RealConstantType>::~Option((Option<Kernel::RealConstantType> *)0x81b385);
  return in_RDI;
}

Assistant:

inline Option<PolyNf> simplFloor(PolyNf* evalArgs)
{
  using Numeral = typename NumTraits::ConstantType;
  auto inner = evalArgs[0].tryNumeral<NumTraits>();
  if (inner) {
    return some(PolyNf::fromNumeral(Numeral(inner->floor())));
  }  else {
    auto poly = evalArgs[0].wrapPoly<NumTraits>();
    // floor(s1 + ... + sn + t1 + ... + tm) ===> s1 + ... + sn + floor(t1 + ... + tn)
    //                              pulledOut <--^^^^^^^^^^^^^         ^^^^^^^^^^^^^--> keptIn
    Recycled<Stack<Monom<NumTraits>>> pulledOut;
    Recycled<Stack<Monom<NumTraits>>> keptIn;
    for (auto monom : poly->iterSummands()) {
      auto k = monom.numeral;
      auto t = monom.factors;
      if (isInteger(*t)) {
        // floor(t + k t) ==> floor(t + (k - i) t) + i t
        //   where t is an integer and
        //         i = floor(k)
        auto i = Numeral(k.floor());
        if (i       != 0) { pulledOut->push(Monom(i   , t)); }
        if ((k - i) != 0) { keptIn->   push(Monom(k -i, t)); }
      } else {
        keptIn->push(monom);
      }
    }

    if (pulledOut->size() == 0) {
      return {};

    } else {


      if (keptIn->size() == 0) {

      } else if (keptIn->size() == 1 && (*keptIn)[0].isNumeral()) { 
        auto numFloor = Numeral((*keptIn)[0].tryNumeral()->floor());
        if (numFloor != 0)
          pulledOut->push(Monom<NumTraits>(numFloor));
      } else {
        auto innerSum = PolyNf(AnyPoly(perfect(Polynom<NumTraits>(std::move(*keptIn)))));
        auto floorTerm = PolyNf(perfect(FuncTerm(FuncId::fromInterpretation(NumTraits::floorI), &innerSum)));
        pulledOut->push(Monom<NumTraits>(Numeral(1), perfect(MonomFactors<NumTraits>(floorTerm))));
      }


      std::sort(pulledOut->begin(), pulledOut->end());

      auto out = PolyNf(AnyPoly(perfect(Polynom<NumTraits>(std::move(*pulledOut)))));
      return some(out);
    }
  }
}